

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O2

void __thiscall
LinkedListPool<depspawn::internal::Workitem,_true,_false>::freeLinkedList
          (LinkedListPool<depspawn::internal::Workitem,_true,_false> *this,Workitem *datain,
          Workitem *last_datain,bool no_dealloc)

{
  bool bVar1;
  
  last_datain->next = (this->head_)._M_b._M_p;
  do {
    bVar1 = std::atomic<depspawn::internal::Workitem_*>::compare_exchange_weak
                      (&this->head_,&last_datain->next,
                       (__pointer_type)
                       (((ulong)*(ushort *)((long)&last_datain->next + 6) << 0x30) + 0x1000000000000
                       | (ulong)datain),memory_order_seq_cst);
  } while (!bVar1);
  return;
}

Assistant:

void freeLinkedList(T* const datain, T* const last_datain, const bool no_dealloc = false) noexcept(ALLOC_ONCE)
  {
    if (!ALLOC_ONCE && !no_dealloc) {
      last_datain->next = nullptr;
      for (T* p = datain; p != nullptr; p = static_cast<T *>(p->next)) {
        p->~T();
      }
    }

    last_datain->next = head_.load(std::memory_order_relaxed);
    while(!head_.compare_exchange_weak(reinterpret_cast<T*&>(last_datain->next), next_ptr(datain, static_cast<T *>(last_datain->next))));
  }